

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_pubkey *psVar1;
  size_t heap_size;
  int iVar2;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  ulong i;
  secp256k1_pubkey_sort_cmp_data cmp_data;
  
  if (pubkeys == (secp256k1_pubkey **)0x0) {
    (*(ctx->illegal_callback).fn)("pubkeys != NULL",(ctx->illegal_callback).data);
    iVar2 = 0;
  }
  else {
    i = n_pubkeys >> 1;
    cmp_data.ctx = ctx;
    while (i = i - 1, i != 0xffffffffffffffff) {
      heap_down((uchar *)pubkeys,i,n_pubkeys,(size_t)&cmp_data,in_R8,in_R9);
    }
    iVar2 = 1;
    for (heap_size = n_pubkeys - 1; 1 < heap_size + 1; heap_size = heap_size - 1) {
      psVar1 = *pubkeys;
      *pubkeys = pubkeys[heap_size];
      pubkeys[heap_size] = psVar1;
      heap_down((uchar *)pubkeys,0,heap_size,(size_t)&cmp_data,in_R8,in_R9);
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    secp256k1_pubkey_sort_cmp_data cmp_data;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    cmp_data.ctx = ctx;

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_pubkey_sort_cmp, &cmp_data);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}